

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O3

Matrix3x3 * __thiscall CGL::Matrix3x3::inv(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int i_1;
  long lVar11;
  double *pdVar12;
  int i;
  long lVar13;
  long lVar14;
  double dVar15;
  undefined1 auVar16 [16];
  bool bVar18;
  undefined8 uVar19;
  long lVar17;
  
  auVar10 = _DAT_001900d0;
  auVar9 = _DAT_001900c0;
  lVar11 = 0;
  lVar13 = 0;
  pdVar12 = (double *)__return_storage_ptr__;
  do {
    lVar14 = 0;
    auVar16 = auVar9;
    do {
      bVar18 = SUB164(auVar16 ^ auVar10,4) == -0x80000000 &&
               SUB164(auVar16 ^ auVar10,0) < -0x7ffffffd;
      if (bVar18) {
        uVar19 = 0x3ff0000000000000;
        if (lVar11 != lVar14) {
          uVar19 = 0;
        }
        *(undefined8 *)((long)pdVar12 + lVar14) = uVar19;
      }
      if (bVar18) {
        uVar19 = 0x3ff0000000000000;
        if (lVar11 + -0x18 != lVar14) {
          uVar19 = 0;
        }
        *(undefined8 *)((long)pdVar12 + lVar14 + 0x18) = uVar19;
      }
      lVar17 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar17 + 2;
      lVar14 = lVar14 + 0x30;
    } while (lVar14 != 0x60);
    lVar13 = lVar13 + 1;
    lVar11 = lVar11 + 0x18;
    pdVar12 = pdVar12 + 1;
  } while (lVar13 != 3);
  dVar15 = this->entries[2].y;
  dVar1 = this->entries[1].y;
  dVar2 = this->entries[2].x;
  dVar3 = this->entries[0].x;
  dVar4 = this->entries[0].y;
  dVar5 = this->entries[2].z;
  dVar7 = this->entries[0].z;
  dVar8 = this->entries[1].x;
  dVar6 = this->entries[1].z;
  __return_storage_ptr__->entries[2].x = dVar1 * -dVar2 + dVar8 * dVar15;
  __return_storage_ptr__->entries[2].y = dVar4 * dVar2 + -dVar3 * dVar15;
  __return_storage_ptr__->entries[0].x = dVar6 * -dVar15 + dVar5 * dVar1;
  __return_storage_ptr__->entries[0].y = dVar7 * dVar15 + -dVar4 * dVar5;
  __return_storage_ptr__->entries[0].z = dVar7 * -dVar1 + dVar4 * dVar6;
  __return_storage_ptr__->entries[1].x = dVar6 * dVar2 + -dVar8 * dVar5;
  __return_storage_ptr__->entries[1].y = -dVar2 * dVar7 + dVar3 * dVar5;
  __return_storage_ptr__->entries[1].z = dVar7 * dVar8 + -dVar3 * dVar6;
  __return_storage_ptr__->entries[2].z = dVar1 * dVar3 - dVar8 * dVar4;
  dVar15 = det(this);
  lVar11 = 0;
  pdVar12 = (double *)__return_storage_ptr__;
  do {
    lVar13 = 0;
    do {
      *(double *)((long)pdVar12 + lVar13) = *(double *)((long)pdVar12 + lVar13) * (1.0 / dVar15);
      lVar13 = lVar13 + 0x18;
    } while (lVar13 != 0x48);
    lVar11 = lVar11 + 1;
    pdVar12 = pdVar12 + 1;
  } while (lVar11 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::inv( void ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B(0,0) = -A(1,2)*A(2,1) + A(1,1)*A(2,2); B(0,1) =  A(0,2)*A(2,1) - A(0,1)*A(2,2); B(0,2) = -A(0,2)*A(1,1) + A(0,1)*A(1,2);
    B(1,0) =  A(1,2)*A(2,0) - A(1,0)*A(2,2); B(1,1) = -A(0,2)*A(2,0) + A(0,0)*A(2,2); B(1,2) =  A(0,2)*A(1,0) - A(0,0)*A(1,2);
    B(2,0) = -A(1,1)*A(2,0) + A(1,0)*A(2,1); B(2,1) =  A(0,1)*A(2,0) - A(0,0)*A(2,1); B(2,2) = -A(0,1)*A(1,0) + A(0,0)*A(1,1);

    B /= det();

    return B;
  }